

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreePrevious(BtCursor *pCur,int flags)

{
  uint uVar1;
  MemPage *pMVar2;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)flags;
  pCur->curFlags = pCur->curFlags & 0xf1;
  (pCur->info).nSize = 0;
  if (((pCur->eState == '\0') && (pCur->ix != 0)) && (pCur->pPage->leaf != '\0')) {
    pCur->ix = pCur->ix - 1;
    return 0;
  }
  if (pCur->eState != 0) {
    iVar4 = 0;
    if (2 < pCur->eState) {
      iVar4 = btreeRestoreCursorPosition(pCur);
    }
    if (iVar4 != 0) {
      return iVar4;
    }
    if (pCur->eState == '\x01') {
      return 0x65;
    }
    if ((pCur->eState == '\x02') && (pCur->eState = '\0', pCur->skipNext < 0)) {
      return 0;
    }
  }
  pMVar2 = pCur->pPage;
  uVar3 = pCur->ix;
  if (pMVar2->leaf == '\0') {
    uVar1 = *(uint *)(pMVar2->aData +
                     (CONCAT11(pMVar2->aCellIdx[(ulong)uVar3 * 2],
                               pMVar2->aCellIdx[(ulong)uVar3 * 2 + 1]) & pMVar2->maskPage));
    iVar4 = moveToChild(pCur,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                             uVar1 << 0x18);
    if (iVar4 == 0) {
      iVar4 = moveToRightmost(pCur);
      return iVar4;
    }
  }
  else {
    while (uVar3 == 0) {
      if (pCur->iPage == '\0') {
        pCur->eState = '\x01';
        return 0x65;
      }
      moveToParent(pCur);
      uVar3 = pCur->ix;
    }
    pCur->ix = uVar3 - 1;
    iVar4 = 0;
    if ((pCur->pPage->intKey != '\0') && (pCur->pPage->leaf == '\0')) {
      iVar4 = sqlite3BtreePrevious(pCur,(int)uVar5);
      return iVar4;
    }
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePrevious(BtCursor *pCur, int flags){
  assert( cursorOwnsBtShared(pCur) );
  assert( flags==0 || flags==1 );
  UNUSED_PARAMETER( flags );  /* Used in COMDB2 but not native SQLite */
  pCur->curFlags &= ~(BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey);
  pCur->info.nSize = 0;
  if( pCur->eState!=CURSOR_VALID
   || pCur->ix==0
   || pCur->pPage->leaf==0
  ){
    return btreePrevious(pCur);
  }
  pCur->ix--;
  return SQLITE_OK;
}